

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall
FileTokenizer::createToken(FileTokenizer *this,TokenType type,size_t length,double value)

{
  size_t sVar1;
  string local_40;
  
  (this->token).type = type;
  sVar1 = this->linePos;
  (this->token).line = this->lineNumber;
  (this->token).column = sVar1 + 1;
  std::__cxx11::string::substr((ulong)&local_40,(ulong)&this->currentLine);
  Token::setValue<double>(&this->token,value,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this->linePos = this->linePos + length;
  return;
}

Assistant:

void FileTokenizer::createToken(TokenType type, size_t length, double value)
{
	token.type = type;
	token.line = lineNumber;
	token.column = linePos+1;
	token.setValue(value, currentLine.substr(linePos, length));

	linePos += length;
}